

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O2

int32_t __thiscall
icu_63::UnicodeSet::spanBackUTF8
          (UnicodeSet *this,char *s,int32_t length,USetSpanCondition spanCondition)

{
  byte bVar1;
  UBool UVar2;
  int32_t iVar3;
  uint uVar4;
  uint c;
  size_t sVar5;
  UnicodeSetStringSpan *this_00;
  ulong uVar6;
  uint local_14c;
  UnicodeSetStringSpan strSpan;
  
  sVar5 = (size_t)(uint)length;
  if (length < 1) {
    if (-1 < length) {
      return 0;
    }
    sVar5 = strlen(s);
    if ((int)sVar5 == 0) {
      return 0;
    }
  }
  else if (this->bmpSet != (BMPSet *)0x0) {
    iVar3 = BMPSet::spanBackUTF8(this->bmpSet,(uint8_t *)s,length,spanCondition);
    return iVar3;
  }
  if (this->stringSpan != (UnicodeSetStringSpan *)0x0) {
    iVar3 = UnicodeSetStringSpan::spanBackUTF8
                      (this->stringSpan,(uint8_t *)s,(int32_t)sVar5,spanCondition);
    return iVar3;
  }
  if (this->strings->count != 0) {
    this_00 = &strSpan;
    UnicodeSetStringSpan::UnicodeSetStringSpan
              (this_00,this,this->strings,0x16 - (spanCondition == USET_SPAN_NOT_CONTAINED));
    if (strSpan.maxLength8 != 0) {
      uVar4 = UnicodeSetStringSpan::spanBackUTF8(&strSpan,(uint8_t *)s,(int32_t)sVar5,spanCondition)
      ;
      this_00 = (UnicodeSetStringSpan *)(ulong)uVar4;
    }
    UnicodeSetStringSpan::~UnicodeSetStringSpan(&strSpan);
    if (strSpan.maxLength8 != 0) {
      return (int32_t)this_00;
    }
  }
  uVar6 = sVar5 & 0xffffffff;
  do {
    uVar4 = (uint)uVar6;
    local_14c = uVar4 - 1;
    bVar1 = s[(long)(int)uVar4 + -1];
    c = (uint)bVar1;
    if ((char)bVar1 < '\0') {
      c = utf8_prevCharSafeBody_63((uint8_t *)s,0,(int32_t *)&local_14c,(uint)bVar1,-3);
    }
    UVar2 = contains(this,c);
  } while (((uint)(spanCondition != USET_SPAN_NOT_CONTAINED) == (int)UVar2) &&
          (uVar6 = (ulong)local_14c, uVar4 = local_14c, 0 < (int)local_14c));
  return uVar4;
}

Assistant:

int32_t UnicodeSet::spanBackUTF8(const char *s, int32_t length, USetSpanCondition spanCondition) const {
    if(length>0 && bmpSet!=NULL) {
        const uint8_t *s0=(const uint8_t *)s;
        return bmpSet->spanBackUTF8(s0, length, spanCondition);
    }
    if(length<0) {
        length=(int32_t)uprv_strlen(s);
    }
    if(length==0) {
        return 0;
    }
    if(stringSpan!=NULL) {
        return stringSpan->spanBackUTF8((const uint8_t *)s, length, spanCondition);
    } else if(!strings->isEmpty()) {
        uint32_t which= spanCondition==USET_SPAN_NOT_CONTAINED ?
                            UnicodeSetStringSpan::BACK_UTF8_NOT_CONTAINED :
                            UnicodeSetStringSpan::BACK_UTF8_CONTAINED;
        UnicodeSetStringSpan strSpan(*this, *strings, which);
        if(strSpan.needsStringSpanUTF8()) {
            return strSpan.spanBackUTF8((const uint8_t *)s, length, spanCondition);
        }
    }

    if(spanCondition!=USET_SPAN_NOT_CONTAINED) {
        spanCondition=USET_SPAN_CONTAINED;  // Pin to 0/1 values.
    }

    UChar32 c;
    int32_t prev=length;
    do {
        U8_PREV_OR_FFFD(s, 0, length, c);
        if(spanCondition!=contains(c)) {
            break;
        }
    } while((prev=length)>0);
    return prev;
}